

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O1

void __thiscall
imrt::Ant::generateTour
          (Ant *this,
          vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
          *probability,vector<maths::Matrix,_std::allocator<maths::Matrix>_> *iprobability)

{
  _List_node_base *p_Var1;
  long lVar2;
  key_type_conflict kVar3;
  int iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  pair<int,_int> p;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  double value;
  key_type_conflict local_5c;
  long local_58;
  Station *local_50;
  double local_48;
  long local_40;
  vector<maths::Matrix,_std::allocator<maths::Matrix>_> *local_38;
  
  local_38 = iprobability;
  if (0 < this->n_stations) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      p_Var1 = (this->p->stations).
               super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
               super__List_node_base._M_next;
      lVar7 = lVar8;
      lVar2 = lVar9;
      while (lVar2 != 0) {
        p_Var1 = p_Var1->_M_next;
        lVar7 = lVar7 + 1;
        lVar2 = lVar7;
      }
      local_50 = (Station *)p_Var1[1]._M_next;
      local_5c = 0;
      local_58 = lVar9;
      local_40 = lVar8;
      if (0 < this->n_apertures) {
        do {
          iVar4 = rand();
          local_48 = (double)iVar4 / 2147483647.0;
          iVar4 = Collimator::getIntensityLevelSize(this->collimator);
          lVar8 = local_58;
          if (0 < iVar4) {
            lVar9 = 0;
            bVar10 = false;
            do {
              kVar3 = local_5c;
              if (local_48 <=
                  (local_38->super__Vector_base<maths::Matrix,_std::allocator<maths::Matrix>_>).
                  _M_impl.super__Vector_impl_data._M_start[lVar8].p[local_5c][lVar9]) {
                *(int *)(*(long *)&(this->ref_intensity).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + (long)local_5c * 4) = (int)lVar9;
                value = Collimator::getLevelIntensity(this->collimator,(int)lVar9);
                Station::setApertureIntensity(local_50,kVar3,value);
                bVar10 = true;
              }
              lVar9 = lVar9 + 1;
              iVar4 = Collimator::getIntensityLevelSize(this->collimator);
            } while ((lVar9 < iVar4) && (!bVar10));
          }
          iVar4 = Collimator::getXdim(this->collimator);
          lVar8 = local_58;
          if (0 < iVar4) {
            lVar9 = 0;
            do {
              iVar4 = rand();
              local_48 = (double)iVar4 / 2147483647.0;
              iVar4 = Collimator::getReferenceSize(this->collimator);
              if (0 < iVar4) {
                lVar7 = 0;
                bVar10 = false;
                do {
                  pmVar5 = std::
                           map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                           ::operator[]((probability->
                                        super__Vector_base<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar8,&local_5c
                                       );
                  if (local_48 <= pmVar5->p[lVar9][lVar7]) {
                    pmVar6 = std::
                             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                             ::operator[]((this->ref_plan).
                                          super__Vector_base<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar8,
                                          &local_5c);
                    kVar3 = local_5c;
                    (pmVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar9] = (int)lVar7;
                    p = Collimator::getReference(this->collimator,(int)lVar7);
                    Station::setApertureShape(local_50,kVar3,(int)lVar9,p);
                    bVar10 = true;
                  }
                  lVar7 = lVar7 + 1;
                  iVar4 = Collimator::getReferenceSize(this->collimator);
                } while ((lVar7 < iVar4) && (!bVar10));
              }
              lVar9 = lVar9 + 1;
              iVar4 = Collimator::getXdim(this->collimator);
            } while (lVar9 < iVar4);
          }
          local_5c = local_5c + 1;
        } while (local_5c < this->n_apertures);
      }
      Station::generateIntensity(local_50);
      lVar9 = local_58 + 1;
      lVar8 = local_40 + -1;
    } while (lVar9 < this->n_stations);
  }
  Plan::eval(this->p);
  return;
}

Assistant:

void Ant::generateTour(vector<map <int, Matrix>> & probability, vector<Matrix>& iprobability) {
    double aux;
    bool flag;
    Station * st;
    for (int s = 0; s < n_stations; s++) {
      st = p->get_station(s);
      for (int ap=0; ap < n_apertures; ap++) {
        // Choose intensity
        aux = rand() / double(RAND_MAX);
        flag=false;
        for (int i=0; i< collimator.getIntensityLevelSize() && !flag; i++){
          if (iprobability[s](ap,i) >= aux ) {
            ref_intensity[s][ap]=i;
            st->setApertureIntensity(ap, collimator.getLevelIntensity(i));
            flag=true;
          }
        }
        
        // Choose aperture pattern 
        for (int j = 0; j < collimator.getXdim(); j++) {
          aux = rand() / double(RAND_MAX);
          flag = false;
          for (int r = 0; r < collimator.getReferenceSize() && !flag; r++) {
            if (probability[s][ap](j,r) >= aux) {
              ref_plan[s][ap][j] = r;
              st->setApertureShape(ap,j,collimator.getReference(r));
              flag = true;
            }
          }
        }
      }
      st->generateIntensity();
    }
    p->eval();
  }